

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O1

SubtableSymbol * WithBlock::getCurrentSubtable(list<WithBlock,_std::allocator<WithBlock>_> *stack)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)stack;
  do {
    p_Var1 = (((_List_base<WithBlock,_std::allocator<WithBlock>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)stack) {
      return (SubtableSymbol *)0x0;
    }
  } while ((SubtableSymbol *)p_Var1[1]._M_next == (SubtableSymbol *)0x0);
  return (SubtableSymbol *)p_Var1[1]._M_next;
}

Assistant:

SubtableSymbol *WithBlock::getCurrentSubtable(const list<WithBlock> &stack)

{
  list<WithBlock>::const_iterator iter;
  for(iter=stack.begin();iter!=stack.end();++iter) {
    if ((*iter).ss != (SubtableSymbol *)0)
      return (*iter).ss;
  }
  return (SubtableSymbol *)0;
}